

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O3

void __thiscall
ON_DimStyle::SetUnitSystemFromContext
          (ON_DimStyle *this,bool bUseName,LengthUnitSystem source_unit_system,
          LengthUnitSystem destination_unit_system)

{
  ON_UUID id_00;
  LengthUnitSystem LVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ON_NameHash *pOVar5;
  ON_DimStyle *this_00;
  ON_UUID *pOVar6;
  wchar_t *pwVar7;
  wchar_t *string1;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  uint uVar8;
  LengthUnitSystem LVar9;
  ulong uVar10;
  size_t new_capacity;
  wchar_t *pwVar11;
  ON_wString unit_name;
  ON_SimpleArray<ON_LengthUnitName> name_list;
  ON_wString dim_style_name;
  ON_UUID id;
  ON_NameHash name_hash;
  bool local_bc;
  ON_wString in_stack_ffffffffffffff48;
  uchar in_stack_ffffffffffffff50 [8];
  ON_wString local_98;
  uint local_8c;
  undefined4 local_88;
  undefined4 local_84;
  ON_DimStyle *local_80;
  ON_UUID_struct local_78;
  ulong local_68;
  uchar local_60 [8];
  undefined1 local_58 [16];
  ON_UUID local_48;
  uchar local_38 [8];
  
  local_84 = (undefined4)CONCAT71(in_register_00000009,destination_unit_system);
  local_88 = (undefined4)CONCAT71(in_register_00000011,source_unit_system);
  LVar1 = this->m_dimstyle_unitsystem;
  uVar8 = 0;
  if ((LVar1 != CustomUnits) && (uVar8 = 0, LVar1 != Unset)) {
    uVar8 = (uint)LVar1;
  }
  LVar1 = ON::LengthUnitSystemFromUnsigned(uVar8);
  if (((LVar1 == None) || (LVar1 == Unset)) || (LVar1 == CustomUnits)) {
    uVar8 = 0;
    local_60 = (uchar  [8])&PTR__ON_SimpleArray_0080f228;
    do {
      if (bUseName || uVar8 != 0) {
        if (uVar8 == 0) {
          pOVar5 = ON_ModelComponent::NameHash(&this->super_ON_ModelComponent);
          local_58._0_4_ = pOVar5->m_flags;
          local_58[4] = (pOVar5->m_sha1_hash).m_digest[0];
          local_58[5] = (pOVar5->m_sha1_hash).m_digest[1];
          local_58[6] = (pOVar5->m_sha1_hash).m_digest[2];
          local_58[7] = (pOVar5->m_sha1_hash).m_digest[3];
          local_58._8_8_ = *(undefined8 *)((pOVar5->m_sha1_hash).m_digest + 4);
          local_48._0_8_ = *(undefined8 *)((pOVar5->m_sha1_hash).m_digest + 0xc);
          local_48.Data4 = *(uchar (*) [8])&pOVar5->m_parent_id;
          local_38 = *&(pOVar5->m_parent_id).Data4;
          bVar2 = ON_NameHash::IsValidAndNotEmpty((ON_NameHash *)local_58);
          if (bVar2) {
            this_00 = SystemDimstyleFromName((ON_NameHash *)local_58);
            pOVar5 = ON_ModelComponent::NameHash(&this_00->super_ON_ModelComponent);
            bVar2 = ::operator==((ON_NameHash *)local_58,pOVar5);
            if (!bVar2) goto LAB_00451f90;
            pOVar5 = ON_ModelComponent::NameHash(&Default.super_ON_ModelComponent);
            bVar2 = ::operator!=((ON_NameHash *)local_58,pOVar5);
            if (!bVar2) goto LAB_00451f90;
LAB_00451ffc:
            LVar1 = this_00->m_dimstyle_unitsystem;
            LVar9 = None;
            if ((LVar1 != CustomUnits) && (LVar1 != Unset)) {
              LVar9 = LVar1;
            }
          }
          else {
LAB_00451f90:
            pOVar6 = ON_ModelComponent::Id(&this->super_ON_ModelComponent);
            local_78.Data1 = pOVar6->Data1;
            local_78.Data2 = pOVar6->Data2;
            local_78.Data3 = pOVar6->Data3;
            local_78.Data4 = *&pOVar6->Data4;
            bVar2 = ::operator!=(&ON_nil_uuid,&local_78);
            if (bVar2) {
              id_00.Data4[0] = in_stack_ffffffffffffff50[0];
              id_00.Data4[1] = in_stack_ffffffffffffff50[1];
              id_00.Data4[2] = in_stack_ffffffffffffff50[2];
              id_00.Data4[3] = in_stack_ffffffffffffff50[3];
              id_00.Data4[4] = in_stack_ffffffffffffff50[4];
              id_00.Data4[5] = in_stack_ffffffffffffff50[5];
              id_00.Data4[6] = in_stack_ffffffffffffff50[6];
              id_00.Data4[7] = in_stack_ffffffffffffff50[7];
              id_00._0_8_ = in_stack_ffffffffffffff48.m_s;
              this_00 = SystemDimstyleFromId(id_00);
              pOVar6 = ON_ModelComponent::Id(&this_00->super_ON_ModelComponent);
              bVar2 = ::operator==(&local_78,pOVar6);
              if (bVar2) {
                pOVar6 = ON_ModelComponent::Id(&Default.super_ON_ModelComponent);
                bVar2 = ::operator!=(&local_78,pOVar6);
                if (bVar2) goto LAB_00451ffc;
              }
            }
            ON_ModelComponent::Name((ON_ModelComponent *)&local_98);
            ON_wString::TrimLeftAndRight(&local_98,(wchar_t *)0x0);
            ON_wString::MakeLowerOrdinal(&local_98);
            bVar2 = ON_wString::IsEmpty(&local_98);
            if (((bVar2) || (uVar3 = ON_wString::Length(&local_98), (int)uVar3 < 1)) ||
               (uVar4 = ON_LengthUnitName::GetLengthUnitNameList(0,(ON_LengthUnitName *)0x0),
               uVar4 == 0)) {
              LVar9 = None;
            }
            else {
              new_capacity = (size_t)uVar4;
              in_stack_ffffffffffffff50 = local_60;
              ON_SimpleArray<ON_LengthUnitName>::SetCapacity
                        ((ON_SimpleArray<ON_LengthUnitName> *)&stack0xffffffffffffff50,new_capacity)
              ;
              if (((int)uVar4 < 0) || (0 < (int)uVar4)) {
                new_capacity = 0;
                uVar4 = 0;
              }
              ON_LengthUnitName::GetLengthUnitNameList(new_capacity,(ON_LengthUnitName *)0x0);
              if (uVar4 != 0) {
                local_68 = (ulong)uVar3;
                uVar10 = 0;
                local_8c = uVar3;
                local_80 = this;
                do {
                  LVar1 = ON_LengthUnitName::LengthUnit((ON_LengthUnitName *)(uVar10 * 0x10));
                  bVar2 = ON::IsTerrestrialLengthUnit(LVar1);
                  if ((bVar2) &&
                     ((bVar2 = ON::IsMetricLengthUnit(LVar1), bVar2 ||
                      (bVar2 = ON::IsUnitedStatesCustomaryLengthUnit(LVar1), bVar2)))) {
                    pwVar7 = ON_LengthUnitName::LengthUnitName((ON_LengthUnitName *)(uVar10 * 0x10))
                    ;
                    ON_wString::ON_wString((ON_wString *)&stack0xffffffffffffff48,pwVar7);
                    ON_wString::TrimLeftAndRight
                              ((ON_wString *)&stack0xffffffffffffff48,(wchar_t *)0x0);
                    ON_wString::MakeLowerOrdinal((ON_wString *)&stack0xffffffffffffff48);
                    bVar2 = ON_wString::IsEmpty((ON_wString *)&stack0xffffffffffffff48);
                    if ((!bVar2) &&
                       (uVar3 = ON_wString::Length((ON_wString *)&stack0xffffffffffffff48),
                       (int)uVar3 <= (int)local_8c && 0 < (int)uVar3)) {
                      pwVar7 = ON_wString::operator_cast_to_wchar_t_(&local_98);
                      pwVar11 = pwVar7 + (local_68 - uVar3);
                      for (; pwVar7 <= pwVar11; pwVar7 = pwVar7 + 1) {
                        string1 = ON_wString::operator_cast_to_wchar_t_
                                            ((ON_wString *)&stack0xffffffffffffff48);
                        bVar2 = ON_wString::EqualOrdinal(string1,uVar3,pwVar7,uVar3,false);
                        if (bVar2) {
                          bVar2 = ON::IsUnitedStatesCustomaryLengthUnit(LVar1);
                          LVar9 = Millimeters;
                          if (bVar2) {
                            LVar9 = Inches;
                          }
                          ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff48);
                          this = local_80;
                          goto LAB_00452216;
                        }
                      }
                    }
                    ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff48);
                    this = local_80;
                  }
                  uVar10 = uVar10 + 1;
                } while (uVar10 < uVar4);
              }
              LVar9 = None;
LAB_00452216:
              ON_SimpleArray<ON_LengthUnitName>::~ON_SimpleArray
                        ((ON_SimpleArray<ON_LengthUnitName> *)&stack0xffffffffffffff50);
            }
            ON_wString::~ON_wString(&local_98);
          }
        }
        else {
          LVar9 = (LengthUnitSystem)local_84;
          if (uVar8 == 1) {
            LVar9 = (LengthUnitSystem)local_88;
          }
          bVar2 = ON::IsUnitedStatesPrinterLengthUnit(LVar9);
          if (!bVar2) {
            bVar2 = ON::IsTerrestrialLengthUnit(LVar9);
            if (!bVar2) goto LAB_00451f03;
            bVar2 = ON::IsUnitedStatesCustomaryLengthUnit(LVar9);
            if (bVar2) {
              LVar1 = Inches;
              goto LAB_00452234;
            }
            bVar2 = ON::IsMetricLengthUnit(LVar9);
            LVar9 = bVar2 * '\x02';
          }
        }
      }
      else {
LAB_00451f03:
        LVar9 = None;
      }
    } while ((uVar8 < 2) && (uVar8 = uVar8 + 1, LVar9 == None));
    LVar1 = Millimeters;
    if (LVar9 != None) {
      LVar1 = LVar9;
    }
  }
LAB_00452234:
  LVar9 = this->m_dimstyle_unitsystem;
  if (((LVar9 == CustomUnits) || (LVar9 == Unset)) || (LVar1 != LVar9)) {
    SetUnitSystem(this,LVar1);
  }
  return;
}

Assistant:

void ON_DimStyle::SetUnitSystemFromContext(
  bool bUseName,
  ON::LengthUnitSystem source_unit_system,
  ON::LengthUnitSystem destination_unit_system
)
{
  /// NOTE WELL: A dimstyle unit system was added in V6, but has never been fully used.
  /// The idea was this would make it easier to figure out what text height/ arrow size, 
  /// ... actually meant. Especially in situations where model space and page space have
  /// different unit systems, and in more complex cases like text in instance definitions
  /// and inserting annotation from models with mismatched unit systems.
  /// It is used internally to get some scales properly set and use in limited
  /// merging contexts.
  ///   
  /// From a user's perspective, in Rhino 6 and Rhino 7 ON_DimStyle lengths like TextHeight(), ArrowSize(), ... 
  /// are with respect to the context the annotation resides in. For example, if TextHeight() = 3.5,
  /// model units = meters, page units = millimeters, and DimScale() = 1, then
  /// text created in model space will be 3.5 meters high and
  /// text created in page space will be 3.5 millimeters high.
  /// 
  /// Ideally, ON_DimStyle::UnitSystem() would specify the text height units 
  /// and ON_DimStyle::DimScale() could be adjusted as model space extents require.
  /// Text in instance definitions would have a well defined height and references
  /// to those instance definitions would display predictably in both model space and page space.


  ON::LengthUnitSystem dim_style_units = ON::LengthUnitSystemFromUnsigned(static_cast<unsigned int>(UnitSystem()));

  switch (dim_style_units)
  {
    case ON::LengthUnitSystem::None:
    case ON::LengthUnitSystem::CustomUnits:
    case ON::LengthUnitSystem::Unset:
      dim_style_units = ON::LengthUnitSystem::None;
      break;
    default:
      break;
  }
  
  for (int pass = 0; pass < 3; pass++)
  {
    if (ON::LengthUnitSystem::None != dim_style_units)
      break;
    if (0 == pass && false == bUseName)
      continue;
    switch (pass)
    {
    case 0: // search dimstyle name for metric or United States customary unit system names
      {
        const ON_NameHash name_hash = NameHash();
        if (name_hash.IsValidAndNotEmpty())
        {
          const ON_DimStyle& from_name = ON_DimStyle::SystemDimstyleFromName(name_hash);
          if (name_hash == from_name.NameHash() && name_hash != ON_DimStyle::Default.NameHash())
          {
            dim_style_units = from_name.UnitSystem();
            continue;
          }
        }
    
        const ON_UUID id = Id();
        if (ON_nil_uuid != id )
        {
          const ON_DimStyle& from_id = ON_DimStyle::SystemDimstyleFromId(id);
          if (id == from_id.Id() && id != ON_DimStyle::Default.Id() )
          {
            dim_style_units = from_id.UnitSystem();
            continue;
          }
        }

        ON_wString dim_style_name = Name();
        dim_style_name.TrimLeftAndRight();
        dim_style_name.MakeLowerOrdinal();
        if (dim_style_name.IsEmpty())
          break;
        const int dim_style_name_length = dim_style_name.Length();
        if (dim_style_name_length <= 0)
          break;

        const size_t name_list_capacity = ON_LengthUnitName::GetLengthUnitNameList(0, nullptr);
        if (name_list_capacity <= 0)
          break;

        ON_SimpleArray<ON_LengthUnitName> name_list(name_list_capacity);
        name_list.SetCount((int)name_list_capacity);
        ON_LengthUnitName::GetLengthUnitNameList(name_list.UnsignedCount(), name_list.Array());
        
        for (unsigned int i = 0; i < name_list.UnsignedCount(); i++)
        {
          ON::LengthUnitSystem name_us = name_list[i].LengthUnit();
          if (false == ON::IsTerrestrialLengthUnit(name_us))
            continue;
          if (
            false == ON::IsMetricLengthUnit(name_us)
            && false == ON::IsUnitedStatesCustomaryLengthUnit(name_us) 
            )
            continue;
          ON_wString unit_name = name_list[i].LengthUnitName();
          unit_name.TrimLeftAndRight();
          unit_name.MakeLowerOrdinal();
          if (unit_name.IsEmpty())
            continue;
          const int name_length = unit_name.Length();
          if (name_length <= 0)
            continue;
          if (name_length > dim_style_name_length )
            continue;

          const wchar_t* s = static_cast<const wchar_t*>(dim_style_name);
          const wchar_t* s1 = s + dim_style_name_length - name_length;
          for (/*empty init*/; s <= s1; s++)
          {
            if (ON_wString::EqualOrdinal(static_cast<const wchar_t*>(unit_name), name_length, s, name_length, false))
            {
              if (ON::IsUnitedStatesCustomaryLengthUnit(name_us))
                dim_style_units = ON::LengthUnitSystem::Inches;
              else
                dim_style_units = ON::LengthUnitSystem::Millimeters;
              break;
            }
          }
          if (ON::LengthUnitSystem::None != dim_style_units)
            break;
        }
      }
      break;

    case 1:
    case 2:
      {
        const ON::LengthUnitSystem context_us
          = (1 == pass)
          ? source_unit_system
          : destination_unit_system;
        if (ON::IsUnitedStatesPrinterLengthUnit(context_us))
          dim_style_units = context_us;
        else if (ON::IsTerrestrialLengthUnit(context_us))
        {
          if (ON::IsUnitedStatesCustomaryLengthUnit(context_us))
            dim_style_units = ON::LengthUnitSystem::Inches;
          else if (ON::IsMetricLengthUnit(context_us))
            dim_style_units = ON::LengthUnitSystem::Millimeters;
        }
      }
      break;
    }
  }

  if (ON::LengthUnitSystem::None == dim_style_units)
    dim_style_units = ON::LengthUnitSystem::Millimeters;

  if( dim_style_units != UnitSystem() )
    SetUnitSystem(dim_style_units);

  return;
}